

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O2

int Abc_NtkEliminateSpecial(Abc_Ntk_t *pNtk,int nMaxSize,int fVerbose)

{
  size_t __size;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar4;
  int *pPermFanin;
  int *pPermFanout;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Abc_Obj_t *pAVar5;
  char *__ptr;
  int iVar6;
  
  if (nMaxSize < 1) {
    __assert_fail("nMaxSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                  ,0x2db,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                  ,0x2dc,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
  }
  iVar1 = Abc_NtkToBdd(pNtk);
  if (iVar1 != 0) {
    Abc_NtkRemoveDupFanins(pNtk);
    Abc_NtkMinimumBase(pNtk);
    iVar6 = 0;
    Abc_NtkCleanup(pNtk,0);
    iVar1 = Abc_NtkToSop(pNtk,-1,1000000000);
    if (iVar1 == 0) {
      __ptr = "Converting to SOP has failed.\n";
      goto LAB_001dba75;
    }
    p = Vec_PtrAlloc(1000);
    for (; iVar6 < pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkObj(pNtk,iVar6);
      if (((((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) &&
           ((pAVar4->vFanouts).nSize == 1)) &&
          ((pAVar5 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray],
           (*(uint *)&pAVar5->field_0x14 & 0xf) == 7 &&
           (iVar1 = Abc_SopGetCubeNum((char *)(pAVar4->field_5).pData), iVar1 == 1)))) &&
         (iVar1 = Abc_SopGetCubeNum((char *)(pAVar5->field_5).pData), iVar1 == 1)) {
        iVar1 = Abc_NodeFindFanin(pAVar5,pAVar4);
        if ((iVar1 < 0) || ((pAVar5->vFanins).nSize <= iVar1)) {
          __assert_fail("RetValue >= 0 && RetValue < Abc_ObjFaninNum(pFanout)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                        ,0x301,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
        }
        iVar2 = Abc_SopIsComplement((char *)(pAVar4->field_5).pData);
        iVar1 = Abc_SopGetIthCareLit((char *)(pAVar5->field_5).pData,iVar1);
        if (iVar2 != iVar1) {
          Vec_PtrPush(p,pAVar4);
        }
      }
    }
    iVar1 = p->nSize;
    if (iVar1 == 0) {
      Vec_PtrFree(p);
      return 1;
    }
    Abc_ObjSortInReverseOrder(pNtk,p);
    iVar6 = Abc_NtkToBdd(pNtk);
    if (iVar6 != 0) {
      __size = (ulong)(uint)nMaxSize * 4 + 4000;
      pPermFanin = (int *)malloc(__size);
      pPermFanout = (int *)malloc(__size);
      p_00 = Vec_PtrAlloc(1000);
      p_01 = Vec_PtrAlloc(1000);
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      iVar6 = 0;
      while( true ) {
        if (iVar6 == iVar1) {
          Abc_NtkBddReorder(pNtk,0);
          Vec_PtrFree(p_00);
          Vec_PtrFree(p_01);
          Vec_PtrFree(p);
          free(pPermFanin);
          free(pPermFanout);
          return 1;
        }
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar6);
        if ((*(uint *)&pAVar4->field_0x14 & 0xf) != 7) break;
        pAVar5 = Abc_NodeFindCoFanout(pAVar4);
        if (pAVar5 != (Abc_Obj_t *)0x0) {
          __assert_fail("Abc_NodeFindCoFanout(pNode) == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                        ,0x31d,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
        }
        Abc_NodeCollectFanouts(pAVar4,p_01);
        for (iVar2 = 0; iVar2 < p_01->nSize; iVar2 = iVar2 + 1) {
          pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p_01,iVar2);
          if (fVerbose != 0) {
            printf("Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                   (ulong)(uint)pAVar4->Id,(ulong)(uint)(pAVar4->vFanins).nSize,
                   (ulong)(uint)pAVar5->Id,(ulong)(uint)(pAVar5->vFanins).nSize);
          }
          iVar3 = Abc_NodeCollapse(pAVar4,pAVar5,p_00,pPermFanin,pPermFanout);
          if (iVar3 == 0) {
            __assert_fail("RetValue",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                          ,0x326,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
          }
          if ((fVerbose != 0) &&
             (pAVar5 = Abc_NtkObj(pNtk,pNtk->vObjs->nSize + -1), pAVar5 != (Abc_Obj_t *)0x0)) {
            printf("resulting in node %5d (supp =%2d).\n",(ulong)(uint)pAVar5->Id,
                   (ulong)(uint)(pAVar5->vFanins).nSize);
          }
        }
        iVar6 = iVar6 + 1;
      }
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcMinBase.c"
                    ,0x31c,"int Abc_NtkEliminateSpecial(Abc_Ntk_t *, int, int)");
    }
  }
  __ptr = "Converting to BDD has failed.\n";
LAB_001dba75:
  fwrite(__ptr,0x1e,1,_stdout);
  return 0;
}

Assistant:

int Abc_NtkEliminateSpecial( Abc_Ntk_t * pNtk, int nMaxSize, int fVerbose )
{
    extern void Abc_NtkBddReorder( Abc_Ntk_t * pNtk, int fVerbose );
    Vec_Ptr_t * vFanouts, * vFanins, * vNodes;
    Abc_Obj_t * pNode, * pFanout;
    int * pPermFanin, * pPermFanout;
    int RetValue, i, k;
    assert( nMaxSize > 0 );
    assert( Abc_NtkIsLogic(pNtk) ); 


    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }

    // prepare nodes for sweeping
    Abc_NtkRemoveDupFanins( pNtk );
    Abc_NtkMinimumBase( pNtk );
    Abc_NtkCleanup( pNtk, 0 );

    // convert network to SOPs
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        fprintf( stdout, "Converting to SOP has failed.\n" );
        return 0;
    }

    // collect info about the nodes to be eliminated
    vNodes = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_ObjFanoutNum(pNode) != 1 )
            continue;
        pFanout = Abc_ObjFanout0(pNode);
        if ( !Abc_ObjIsNode(pFanout) )
            continue;
        if ( Abc_SopGetCubeNum((char *)pNode->pData) != 1 )
            continue;
        if ( Abc_SopGetCubeNum((char *)pFanout->pData) != 1 )
            continue;
        // find the fanout's fanin
        RetValue = Abc_NodeFindFanin( pFanout, pNode );
        assert( RetValue >= 0 && RetValue < Abc_ObjFaninNum(pFanout) );
        // both pNode and pFanout are AND/OR type nodes
        if ( Abc_SopIsComplement((char *)pNode->pData) == Abc_SopGetIthCareLit((char *)pFanout->pData, RetValue) )
            continue;
        Vec_PtrPush( vNodes, pNode );
    }
    if ( Vec_PtrSize(vNodes) == 0 )
    {
        Vec_PtrFree( vNodes );
        return 1;
    }
    Abc_ObjSortInReverseOrder( pNtk, vNodes );

    // convert network to BDD representation
    if ( !Abc_NtkToBdd(pNtk) )
    {
        fprintf( stdout, "Converting to BDD has failed.\n" );
        return 0;
    }

    // go through the nodes and decide is they can be eliminated
    pPermFanin = ABC_ALLOC( int, nMaxSize + 1000 );
    pPermFanout = ABC_ALLOC( int, nMaxSize + 1000 );
    vFanins = Vec_PtrAlloc( 1000 );
    vFanouts = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        assert( Abc_ObjIsNode(pNode) );
        assert( Abc_NodeFindCoFanout(pNode) == NULL );
        // perform elimination
        Abc_NodeCollectFanouts( pNode, vFanouts );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
        {
            if ( fVerbose )
                printf( "Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                    Abc_ObjId(pNode), Abc_ObjFaninNum(pNode), Abc_ObjId(pFanout), Abc_ObjFaninNum(pFanout) ); 
            RetValue = Abc_NodeCollapse( pNode, pFanout, vFanins, pPermFanin, pPermFanout );
            assert( RetValue );
            if ( fVerbose )
            {
                Abc_Obj_t * pNodeNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk) - 1 );
                if ( pNodeNew )
                    printf( "resulting in node %5d (supp =%2d).\n", Abc_ObjId(pNodeNew), Abc_ObjFaninNum(pNodeNew) );
            }
        }
    }
    Abc_NtkBddReorder( pNtk, 0 );
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    ABC_FREE( pPermFanin );
    ABC_FREE( pPermFanout );
    return 1;
}